

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cc
# Opt level: O0

EvalBResults parser::Evaluate(string *ref_fname,string *hyp_fname)

{
  EvalBResults EVar1;
  undefined1 uVar2;
  ostream *poVar3;
  ostream *u0;
  char *__command;
  FILE *__stream;
  istream *piVar4;
  string line;
  istream in;
  stream_buffer<boost::iostreams::file_descriptor_source,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input_seekable>
  fpstream;
  FILE *pipe;
  string cmd;
  EvalBResults r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  type *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  string local_260 [32];
  istream local_240;
  undefined4 local_128;
  int local_124;
  streambuf local_120 [136];
  FILE *local_98;
  string local_80 [32];
  string local_60 [32];
  string local_40 [52];
  undefined8 local_c;
  float local_4;
  
  std::operator+((char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 in_stack_fffffffffffffd90);
  std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
  std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  poVar3 = std::operator<<((ostream *)&std::cerr,"COMMAND: ");
  u0 = std::operator<<(poVar3,local_40);
  std::ostream::operator<<(u0,std::endl<char,std::char_traits<char>>);
  __command = (char *)std::__cxx11::string::c_str();
  __stream = popen(__command,"r");
  local_98 = __stream;
  local_124 = fileno(__stream);
  local_128 = 0;
  boost::iostreams::
  stream_buffer<boost::iostreams::file_descriptor_source,std::char_traits<char>,std::allocator<char>,boost::iostreams::input_seekable>
  ::stream_buffer<int,boost::iostreams::file_descriptor_flags>
            ((stream_buffer<boost::iostreams::file_descriptor_source,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input_seekable>
              *)poVar3,(int *)u0,(file_descriptor_flags *)__stream,in_stack_fffffffffffffd68);
  std::istream::istream(&local_240,local_120);
  std::__cxx11::string::string(local_260);
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_240,local_260);
    uVar2 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&piVar4->_vptr_basic_istream +
                              (long)piVar4->_vptr_basic_istream[-3]));
    if (!(bool)uVar2) break;
    poVar3 = std::operator<<((ostream *)&std::cerr,"Got line: ");
    poVar3 = std::operator<<(poVar3,local_260);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  fclose(local_98);
  std::__cxx11::string::~string(local_260);
  std::istream::~istream(&local_240);
  boost::iostreams::
  stream_buffer<boost::iostreams::file_descriptor_source,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input_seekable>
  ::~stream_buffer((stream_buffer<boost::iostreams::file_descriptor_source,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input_seekable>
                    *)CONCAT17(uVar2,in_stack_fffffffffffffd60));
  std::__cxx11::string::~string(local_40);
  EVar1.f = local_4;
  EVar1.p = (float)(undefined4)local_c;
  EVar1.r = (float)local_c._4_4_;
  return EVar1;
}

Assistant:

EvalBResults Evaluate(const string& ref_fname, const string& hyp_fname) {
  string cmd = "echo " + ref_fname + " " + hyp_fname;
  cerr << "COMMAND: " << cmd << endl;
  FILE *pipe = popen(cmd.c_str(), "r");
  io::stream_buffer<io::file_descriptor_source> fpstream (fileno(pipe), io::never_close_handle);
  istream in(&fpstream);
  string line;
  while(getline(in, line)) {
    cerr << "Got line: " << line << endl;
  }
  fclose(pipe);
  EvalBResults r;
  return r;
}